

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

size_t google::protobuf::internal::StringSpaceUsedExcludingSelfLong(string *str)

{
  string *psVar1;
  size_t sVar2;
  void *end;
  void *start;
  string *str_local;
  
  psVar1 = (string *)std::__cxx11::string::data();
  if ((str <= psVar1) && (psVar1 = (string *)std::__cxx11::string::data(), psVar1 < str + 1)) {
    return 0;
  }
  sVar2 = std::__cxx11::string::capacity();
  return sVar2;
}

Assistant:

size_t StringSpaceUsedExcludingSelfLong(const std::string& str) {
  const void* start = &str;
  const void* end = &str + 1;
  if (start <= str.data() && str.data() < end) {
    // The string's data is stored inside the string object itself.
    return 0;
  } else {
    return str.capacity();
  }
}